

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_mset.pb.cc
# Opt level: O3

void proto2_unittest::NestedTestMessageSetContainer::SharedDtor(MessageLite *self)

{
  TestMessageSetContainer *this;
  MessageLite *pMVar1;
  ulong uVar2;
  undefined8 extraout_RAX;
  
  uVar2 = (self->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
    uVar2 = (self->_internal_metadata_).ptr_;
  }
  if ((uVar2 & 1) != 0) {
    uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  if (uVar2 == 0) {
    this = (TestMessageSetContainer *)self[1]._internal_metadata_.ptr_;
    if (this != (TestMessageSetContainer *)0x0) {
      TestMessageSetContainer::~TestMessageSetContainer(this);
    }
    operator_delete(this,0x20);
    pMVar1 = (MessageLite *)self[2]._vptr_MessageLite;
    if (pMVar1 != (MessageLite *)0x0) {
      SharedDtor(pMVar1);
    }
    operator_delete(pMVar1,0x30);
    pMVar1 = (MessageLite *)self[2]._internal_metadata_.ptr_;
    if (pMVar1 != (MessageLite *)0x0) {
      SharedDtor(pMVar1);
    }
    operator_delete(pMVar1,0x30);
    return;
  }
  SharedDtor((NestedTestMessageSetContainer *)&stack0xffffffffffffffe0);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

inline void NestedTestMessageSetContainer::SharedDtor(MessageLite& self) {
  NestedTestMessageSetContainer& this_ = static_cast<NestedTestMessageSetContainer&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.container_;
  delete this_._impl_.child_;
  delete this_._impl_.lazy_child_;
  this_._impl_.~Impl_();
}